

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsHashTree.h
# Opt level: O0

BranchNode *
HighsHashTree<std::pair<int,_int>,_double>::addChildToBranchNode
          (BranchNode *branch,uint8_t hashValue,int location)

{
  int iVar1;
  size_t sVar2;
  size_t sVar3;
  int in_EDX;
  BranchNode *in_RDI;
  size_t leftSize;
  BranchNode *newBranch;
  size_t rightSize;
  size_t newSize;
  int rightChilds;
  undefined8 in_stack_ffffffffffffffb8;
  size_t sVar4;
  Occupation *in_stack_ffffffffffffffc0;
  BranchNode *local_8;
  
  iVar1 = Occupation::num_set_after
                    (in_stack_ffffffffffffffc0,(uint8_t)((ulong)in_stack_ffffffffffffffb8 >> 0x38));
  sVar2 = getBranchNodeSize(in_EDX + iVar1 + 1);
  sVar4 = sVar2;
  sVar3 = getBranchNodeSize(in_EDX + iVar1);
  if (sVar4 == sVar3) {
    memmove(in_RDI->child + (in_EDX + 1),in_RDI->child + in_EDX,(long)iVar1 << 3);
    local_8 = in_RDI;
  }
  else {
    local_8 = (BranchNode *)operator_new(sVar2);
    memcpy(local_8,in_RDI,(long)(in_EDX + -1) * 8 + 0x10);
    memcpy(local_8->child + (in_EDX + 1),in_RDI->child + in_EDX,(long)iVar1 << 3);
    destroyBranchingNode((void *)0x73b99e);
  }
  return local_8;
}

Assistant:

static BranchNode* addChildToBranchNode(BranchNode* branch, uint8_t hashValue,
                                          int location) {
    int rightChilds = branch->occupation.num_set_after(hashValue);
    assert(rightChilds + location == branch->occupation.num_set());

    size_t newSize = getBranchNodeSize(location + rightChilds + 1);
    size_t rightSize = rightChilds * sizeof(NodePtr);

    if (newSize == getBranchNodeSize(location + rightChilds)) {
      memmove(&branch->child[location + 1], &branch->child[location],
              rightSize);

      return branch;
    }

    BranchNode* newBranch = (BranchNode*)::operator new(newSize);
    // sizeof(Branch) already contains the size for 1 pointer. So we just
    // need to add the left and right sizes up for the number of
    // additional pointers
    size_t leftSize = sizeof(BranchNode) + (location - 1) * sizeof(NodePtr);

    memcpy(newBranch, branch, leftSize);
    memcpy(&newBranch->child[location + 1], &branch->child[location],
           rightSize);

    destroyBranchingNode(branch);

    return newBranch;
  }